

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall
QTreeModel::emitDataChanged(QTreeModel *this,QTreeWidgetItem *item,int column,QList<int> *roles)

{
  bool bVar1;
  int iVar2;
  QAbstractItemModel *in_RCX;
  int in_EDX;
  QTreeWidgetItem *in_RSI;
  QTreeModel *in_RDI;
  long in_FS_OFFSET;
  QModelIndex topLeft;
  QModelIndex bottomRight;
  SkipSorting skipSorting;
  int in_stack_ffffffffffffff14;
  QTreeWidgetItem *local_c0;
  Data *local_b8;
  QTreeWidgetItem *local_b0;
  undefined1 local_a8 [24];
  QTreeWidgetItem *local_90;
  Data *local_88;
  QTreeWidgetItem *local_80;
  QTreeWidgetItem *local_78;
  Data *local_70;
  QTreeWidgetItem *local_68;
  QModelIndex local_60;
  QTreeWidgetItem *local_48;
  Data *local_40;
  QTreeWidgetItem *local_38;
  undefined1 local_30 [24];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QObject::signalsBlocked((QObject *)0x9119be);
  if (!bVar1) {
    if ((in_RDI->headerItem == in_RSI) &&
       (in_stack_ffffffffffffff14 = in_EDX,
       iVar2 = QTreeWidgetItem::columnCount((QTreeWidgetItem *)0x9119eb),
       in_stack_ffffffffffffff14 < iVar2)) {
      if (in_EDX == -1) {
        QModelIndex::QModelIndex((QModelIndex *)0x911a09);
        (**(code **)(*(long *)in_RDI + 0x80))(in_RDI,local_30);
        QAbstractItemModel::headerDataChanged((Orientation)in_RDI,1,0);
      }
      else {
        QAbstractItemModel::headerDataChanged((Orientation)in_RDI,1,in_EDX);
      }
    }
    else {
      local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      SkipSorting::SkipSorting((SkipSorting *)local_18,in_RDI);
      local_48 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
      local_40 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::QModelIndex((QModelIndex *)0x911abd);
      local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_60.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      local_60.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::QModelIndex((QModelIndex *)0x911af7);
      if (in_EDX == -1) {
        index((QTreeModel *)&local_78,(char *)in_RDI,(int)in_RSI);
        local_60._0_8_ = local_78;
        local_60.i = (quintptr)local_70;
        local_60.m.ptr = (QAbstractItemModel *)local_68;
        iVar2 = QModelIndex::row(&local_60);
        QModelIndex::QModelIndex((QModelIndex *)0x911b66);
        (**(code **)(*(long *)in_RDI + 0x80))(in_RDI,local_a8);
        QAbstractItemModel::createIndex
                  (in_RCX,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                   (void *)CONCAT44(in_stack_ffffffffffffff14,iVar2));
        local_48 = local_90;
        local_40 = (Data *)local_88;
        local_38 = local_80;
      }
      else {
        index((QTreeModel *)&local_c0,(char *)in_RDI,(int)in_RSI);
        local_60._0_8_ = local_c0;
        local_60.i = (quintptr)local_b8;
        local_60.m.ptr = (QAbstractItemModel *)local_b0;
        local_48 = local_c0;
        local_40 = (Data *)local_b8;
        local_38 = local_b0;
      }
      QAbstractItemModel::dataChanged
                ((QModelIndex *)in_RDI,(QModelIndex *)&local_60,(QList_conflict2 *)&local_48);
      SkipSorting::~SkipSorting((SkipSorting *)local_18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeModel::emitDataChanged(QTreeWidgetItem *item, int column, const QList<int> &roles)
{
    if (signalsBlocked())
        return;

    if (headerItem == item && column < item->columnCount()) {
        if (column == -1)
            emit headerDataChanged(Qt::Horizontal, 0, columnCount() - 1);
        else
            emit headerDataChanged(Qt::Horizontal, column, column);
        return;
    }

    SkipSorting skipSorting(this); //This is a little bit wrong, but not doing it would kill performance

    QModelIndex bottomRight, topLeft;
    if (column == -1) {
        topLeft = index(item, 0);
        bottomRight = createIndex(topLeft.row(), columnCount() - 1, item);
    } else {
        topLeft = index(item, column);
        bottomRight = topLeft;
    }
    emit dataChanged(topLeft, bottomRight, roles);
}